

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize)

{
  undefined4 uVar1;
  ZSTD_compressionParameters cPar;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ZSTD_compressionParameters *pZVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined4 uStack_1c;
  
  uVar6 = 0xffffffffffffffff;
  if (srcSizeHint != 0xffffffffffffffff || dictSize != 0) {
    lVar10 = 500;
    if (dictSize == 0) {
      lVar10 = 0;
    }
    lVar7 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar7 = lVar10;
    }
    uVar6 = lVar7 + dictSize + srcSizeHint;
  }
  lVar10 = (ulong)(uVar6 < 0x20001) + (ulong)(uVar6 < 0x40001) + (ulong)(uVar6 < 0x4001);
  iVar9 = 3;
  if (compressionLevel != 0) {
    iVar9 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar9 = 0;
  }
  iVar5 = 0x16;
  if (compressionLevel < 0x17) {
    iVar5 = iVar9;
  }
  lVar7 = (long)iVar5 * 0x1c;
  lVar11 = lVar10 * 0x284;
  pZVar8 = ZSTD_defaultCParameters[lVar10] + iVar5;
  uVar1 = pZVar8->searchLog;
  uVar2 = pZVar8->windowLog;
  uVar3 = pZVar8->chainLog;
  uVar4 = pZVar8->hashLog;
  cPar.hashLog = uVar4;
  cPar.chainLog = uVar3;
  cPar.windowLog = uVar2;
  if (compressionLevel < 0) {
    iVar9 = -compressionLevel;
  }
  else {
    iVar9 = *(int *)(lVar11 + 0x1a08e4 + lVar7);
  }
  cPar.strategy = *(undefined4 *)(lVar11 + 0x1a08e8 + lVar7);
  cPar.targetLength = iVar9;
  cPar.searchLog = uVar1;
  cPar.minMatch = *(undefined4 *)(lVar11 + 0x1a08e0 + lVar7);
  pZVar8 = ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return pZVar8;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    int const unknown = srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN;
    size_t const addedSize = unknown && dictSize > 0 ? 500 : 0;
    U64 const rSize = unknown && dictSize == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : srcSizeHint+dictSize+addedSize;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}